

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

void __thiscall
irr::core::string<unsigned_long>::string<unsigned_long>
          (string<unsigned_long> *this,unsigned_long *c,s32 lenght)

{
  uint uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->array = (unsigned_long *)0x0;
  this->allocated = 0;
  this->used = 0;
  if (c != (unsigned_long *)0x0) {
    uVar1 = lenght + 1;
    this->used = uVar1;
    this->allocated = uVar1;
    uVar3 = 0xffffffffffffffff;
    if (-2 < lenght) {
      uVar3 = (ulong)uVar1 << 3;
    }
    puVar2 = (unsigned_long *)operator_new__(uVar3);
    this->array = puVar2;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < lenght) {
      uVar4 = (ulong)(uint)lenght;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      this->array[uVar3] = c[uVar3];
    }
    this->array[lenght] = 0;
  }
  return;
}

Assistant:

string(const B* c, s32 lenght)
	: array(0), allocated(0), used(0)
	{
		if (!c)
			return;

        allocated = used = lenght+1;
		array = new T[used];

		for (s32 l = 0; l<lenght; ++l)
			array[l] = (T)c[l];

		array[lenght] = 0;
	}